

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerThreadPool.cpp
# Opt level: O0

void __thiscall PyreNet::LayerThreadPool::LayerThreadPool(LayerThreadPool *this)

{
  int local_20;
  int i;
  LayerThreadPool *this_local;
  
  std::vector<std::thread,_std::allocator<std::thread>_>::vector(&this->pool);
  std::condition_variable::condition_variable(&this->jobDoneCv);
  std::condition_variable::condition_variable(&this->newJobCv);
  std::mutex::mutex(&this->trackMutex);
  std::mutex::mutex(&this->queueMutex);
  std::
  queue<PyreNet::LayerThreadPool::LayerQueueJob,std::deque<PyreNet::LayerThreadPool::LayerQueueJob,std::allocator<PyreNet::LayerThreadPool::LayerQueueJob>>>
  ::
  queue<std::deque<PyreNet::LayerThreadPool::LayerQueueJob,std::allocator<PyreNet::LayerThreadPool::LayerQueueJob>>,void>
            ((queue<PyreNet::LayerThreadPool::LayerQueueJob,std::deque<PyreNet::LayerThreadPool::LayerQueueJob,std::allocator<PyreNet::LayerThreadPool::LayerQueueJob>>>
              *)&this->layerQueue);
  instance = this;
  for (local_20 = 0; local_20 < 0x10; local_20 = local_20 + 1) {
    std::vector<std::thread,std::allocator<std::thread>>::emplace_back<void(&)()>
              ((vector<std::thread,std::allocator<std::thread>> *)this,threadJob);
  }
  return;
}

Assistant:

PyreNet::LayerThreadPool::LayerThreadPool() {
        instance = this;
        for (int i = 0; i < 16; ++i) {
            pool.emplace_back(threadJob);
        }
    }